

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NeuralNetwork::SerializeWithCachedSizes
          (NeuralNetwork *this,CodedOutputStream *output)

{
  bool bVar1;
  uint uVar2;
  NeuralNetworkMultiArrayShapeMapping NVar3;
  NeuralNetworkImageShapeMapping NVar4;
  NeuralNetworkLayer *value;
  NeuralNetworkPreprocessing *value_00;
  uint local_28;
  uint n_1;
  uint i_1;
  uint n;
  uint i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  NeuralNetwork *this_local;
  
  i_1 = 0;
  uVar2 = layers_size(this);
  for (; i_1 < uVar2; i_1 = i_1 + 1) {
    value = layers(this,i_1);
    google::protobuf::internal::WireFormatLite::WriteMessage(1,&value->super_MessageLite,output);
  }
  local_28 = 0;
  uVar2 = preprocessing_size(this);
  for (; local_28 < uVar2; local_28 = local_28 + 1) {
    value_00 = preprocessing(this,local_28);
    google::protobuf::internal::WireFormatLite::WriteMessage(2,&value_00->super_MessageLite,output);
  }
  NVar3 = arrayinputshapemapping(this);
  if (NVar3 != RANK5_ARRAY_MAPPING) {
    NVar3 = arrayinputshapemapping(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(5,NVar3,output);
  }
  NVar4 = imageinputshapemapping(this);
  if (NVar4 != RANK5_IMAGE_MAPPING) {
    NVar4 = imageinputshapemapping(this);
    google::protobuf::internal::WireFormatLite::WriteEnum(6,NVar4,output);
  }
  bVar1 = has_updateparams(this);
  if (bVar1) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (10,&this->updateparams_->super_MessageLite,output);
  }
  return;
}

Assistant:

void NeuralNetwork::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.NeuralNetwork)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.NeuralNetworkLayer layers = 1;
  for (unsigned int i = 0, n = this->layers_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->layers(i), output);
  }

  // repeated .CoreML.Specification.NeuralNetworkPreprocessing preprocessing = 2;
  for (unsigned int i = 0, n = this->preprocessing_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, this->preprocessing(i), output);
  }

  // .CoreML.Specification.NeuralNetworkMultiArrayShapeMapping arrayInputShapeMapping = 5;
  if (this->arrayinputshapemapping() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      5, this->arrayinputshapemapping(), output);
  }

  // .CoreML.Specification.NeuralNetworkImageShapeMapping imageInputShapeMapping = 6;
  if (this->imageinputshapemapping() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      6, this->imageinputshapemapping(), output);
  }

  // .CoreML.Specification.NetworkUpdateParameters updateParams = 10;
  if (this->has_updateparams()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, *this->updateparams_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.NeuralNetwork)
}